

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O2

void __thiscall cmCPackIFWPackage::GeneratePackageFile(cmCPackIFWPackage *this)

{
  string *__lhs;
  cmCPackIFWGenerator *pcVar1;
  cmCPackLog *this_00;
  bool bVar2;
  _Base_ptr p_Var3;
  long lVar4;
  ostream *poVar5;
  pointer pbVar6;
  ulong uVar7;
  size_t i;
  string *userInterface;
  pointer pbVar8;
  bool bVar9;
  bool bVar10;
  string path_3;
  allocator<char> local_541;
  set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
  compAutoDepSet;
  set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
  compDepSet;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  licenses;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  userInterfaces;
  cmXMLWriter xout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  translations;
  string name;
  cmGeneratedFileStream fout;
  
  __lhs = &this->Directory;
  if ((this->Directory)._M_string_length == 0) {
    if (this->Installer == (cmCPackIFWInstaller *)0x0) {
      pcVar1 = (this->super_cmCPackIFWCommon).Generator;
      if (pcVar1 == (cmCPackIFWGenerator *)0x0) goto LAB_001b21b0;
      std::operator+(&name,&(pcVar1->super_cmCPackGenerator).toplevel,"/packages/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,
                     &name,&this->Name);
    }
    else {
      std::operator+(&name,&this->Installer->Directory,"/packages/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,
                     &name,&this->Name);
    }
    std::__cxx11::string::operator=((string *)__lhs,(string *)&fout);
    std::__cxx11::string::~string((string *)&fout);
    std::__cxx11::string::~string((string *)&name);
  }
LAB_001b21b0:
  std::operator+(&name,__lhs,"/meta/package.xml");
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,&name,false,None);
  std::__cxx11::string::~string((string *)&name);
  cmXMLWriter::cmXMLWriter(&xout,(ostream *)&fout,0);
  cmXMLWriter::StartDocument(&xout,"UTF-8");
  cmCPackIFWCommon::WriteGeneratedByToStrim(&this->super_cmCPackIFWCommon,&xout);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"Package",(allocator<char> *)&compDepSet);
  cmXMLWriter::StartElement(&xout,&name);
  std::__cxx11::string::~string((string *)&name);
  for (p_Var3 = (this->DisplayName)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->DisplayName)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"DisplayName",(allocator<char> *)&compDepSet);
    cmXMLWriter::StartElement(&xout,&name);
    std::__cxx11::string::~string((string *)&name);
    if (p_Var3[1]._M_parent != (_Base_ptr)0x0) {
      cmXMLWriter::Attribute<std::__cxx11::string>
                (&xout,"xml:lang",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1));
    }
    cmXMLWriter::Content<std::__cxx11::string>
              (&xout,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var3 + 2));
    cmXMLWriter::EndElement(&xout);
  }
  for (p_Var3 = (this->Description)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->Description)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"Description",(allocator<char> *)&compDepSet);
    cmXMLWriter::StartElement(&xout,&name);
    std::__cxx11::string::~string((string *)&name);
    if (p_Var3[1]._M_parent != (_Base_ptr)0x0) {
      cmXMLWriter::Attribute<std::__cxx11::string>
                (&xout,"xml:lang",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1));
    }
    cmXMLWriter::Content<std::__cxx11::string>
              (&xout,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var3 + 2));
    cmXMLWriter::EndElement(&xout);
  }
  if ((this->UpdateText)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"UpdateText",(allocator<char> *)&compDepSet);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->UpdateText);
    std::__cxx11::string::~string((string *)&name);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"Name",(allocator<char> *)&compDepSet);
  cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->Name);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"Version",(allocator<char> *)&compDepSet);
  cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->Version);
  std::__cxx11::string::~string((string *)&name);
  if ((this->ReleaseDate)._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"ReleaseDate",(allocator<char> *)&path_3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&compAutoDepSet,"%Y-%m-%d",(allocator<char> *)&userInterfaces);
    cmTimestamp::CurrentTime
              ((string *)&compDepSet,(cmTimestamp *)&local_450,(string *)&compAutoDepSet,true);
    cmXMLWriter::Element<std::__cxx11::string>
              (&xout,&name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&compDepSet);
    std::__cxx11::string::~string((string *)&compDepSet);
    std::__cxx11::string::~string((string *)&compAutoDepSet);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"ReleaseDate",(allocator<char> *)&compDepSet);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->ReleaseDate);
  }
  std::__cxx11::string::~string((string *)&name);
  if ((this->Script)._M_string_length != 0) {
    cmsys::SystemTools::GetFilenameName(&name,&this->Script);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &compAutoDepSet,__lhs,"/meta/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&compDepSet,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &compAutoDepSet,&name);
    std::__cxx11::string::~string((string *)&compAutoDepSet);
    cmsys::SystemTools::CopyFileIfDifferent(&this->Script,(string *)&compDepSet);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&compAutoDepSet,"Script",(allocator<char> *)&path_3);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,(string *)&compAutoDepSet,&name);
    std::__cxx11::string::~string((string *)&compAutoDepSet);
    std::__cxx11::string::~string((string *)&compDepSet);
    std::__cxx11::string::~string((string *)&name);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&userInterfaces,&this->UserInterfaces);
  pbVar8 = userInterfaces.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar6 = userInterfaces.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar8; pbVar6 = pbVar6 + 1) {
    cmsys::SystemTools::GetFilenameName(&name,pbVar6);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &compAutoDepSet,__lhs,"/meta/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&compDepSet,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &compAutoDepSet,&name);
    std::__cxx11::string::~string((string *)&compAutoDepSet);
    cmsys::SystemTools::CopyFileIfDifferent
              (pbVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &compDepSet);
    std::__cxx11::string::_M_assign((string *)pbVar6);
    std::__cxx11::string::~string((string *)&compDepSet);
    std::__cxx11::string::~string((string *)&name);
  }
  if (userInterfaces.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      userInterfaces.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"UserInterfaces",(allocator<char> *)&compDepSet);
    cmXMLWriter::StartElement(&xout,&name);
    std::__cxx11::string::~string((string *)&name);
    for (pbVar8 = userInterfaces.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar8 != userInterfaces.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"UserInterface",(allocator<char> *)&compDepSet);
      cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,pbVar8);
      std::__cxx11::string::~string((string *)&name);
    }
    cmXMLWriter::EndElement(&xout);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&translations,&this->Translations);
  pbVar8 = translations.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar6 = translations.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar8; pbVar6 = pbVar6 + 1) {
    cmsys::SystemTools::GetFilenameName(&name,pbVar6);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &compAutoDepSet,__lhs,"/meta/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&compDepSet,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &compAutoDepSet,&name);
    std::__cxx11::string::~string((string *)&compAutoDepSet);
    cmsys::SystemTools::CopyFileIfDifferent
              (pbVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &compDepSet);
    std::__cxx11::string::_M_assign((string *)pbVar6);
    std::__cxx11::string::~string((string *)&compDepSet);
    std::__cxx11::string::~string((string *)&name);
  }
  if (translations.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      translations.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"Translations",(allocator<char> *)&compDepSet);
    cmXMLWriter::StartElement(&xout,&name);
    std::__cxx11::string::~string((string *)&name);
    for (pbVar8 = translations.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar8 != translations.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"Translation",(allocator<char> *)&compDepSet);
      cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,pbVar8);
      std::__cxx11::string::~string((string *)&name);
    }
    cmXMLWriter::EndElement(&xout);
  }
  pcVar1 = (this->super_cmCPackIFWCommon).Generator;
  if ((pcVar1 == (cmCPackIFWGenerator *)0x0) || ((pcVar1->FrameworkVersion)._M_string_length == 0))
  {
    bVar2 = false;
  }
  else {
    bVar2 = cmCPackIFWCommon::IsVersionLess(&this->super_cmCPackIFWCommon,"3.1");
  }
  compDepSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &compDepSet._M_t._M_impl.super__Rb_tree_header._M_header;
  compDepSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  compDepSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  compDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  compDepSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       compDepSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var3 = (this->AlienDependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->AlienDependencies)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::
    _Rb_tree<cmCPackIFWPackage::DependenceStruct,cmCPackIFWPackage::DependenceStruct,std::_Identity<cmCPackIFWPackage::DependenceStruct>,std::less<cmCPackIFWPackage::DependenceStruct>,std::allocator<cmCPackIFWPackage::DependenceStruct>>
    ::_M_insert_unique<cmCPackIFWPackage::DependenceStruct_const&>
              ((_Rb_tree<cmCPackIFWPackage::DependenceStruct,cmCPackIFWPackage::DependenceStruct,std::_Identity<cmCPackIFWPackage::DependenceStruct>,std::less<cmCPackIFWPackage::DependenceStruct>,std::allocator<cmCPackIFWPackage::DependenceStruct>>
                *)&compDepSet,*(DependenceStruct **)(p_Var3 + 1));
  }
  for (p_Var3 = (this->Dependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->Dependencies)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    DependenceStruct::DependenceStruct
              ((DependenceStruct *)&name,(string *)(*(long *)(p_Var3 + 1) + 0xa8));
    std::
    _Rb_tree<cmCPackIFWPackage::DependenceStruct,_cmCPackIFWPackage::DependenceStruct,_std::_Identity<cmCPackIFWPackage::DependenceStruct>,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
    ::_M_insert_unique<cmCPackIFWPackage::DependenceStruct>
              (&compDepSet._M_t,(DependenceStruct *)&name);
    DependenceStruct::~DependenceStruct((DependenceStruct *)&name);
  }
  if (compDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    bVar9 = false;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
    p_Var3 = compDepSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (bVar2 == false) {
      bVar9 = false;
    }
    else {
      lVar4 = std::__cxx11::string::find
                        ((char)compDepSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left + ' '
                         ,0x2d);
      bVar9 = lVar4 != -1;
    }
    DependenceStruct::NameWithCompare_abi_cxx11_
              ((string *)&compAutoDepSet,(DependenceStruct *)(p_Var3 + 1));
    std::operator<<((ostream *)&name,(string *)&compAutoDepSet);
    std::__cxx11::string::~string((string *)&compAutoDepSet);
    while( true ) {
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      if ((_Rb_tree_header *)p_Var3 == &compDepSet._M_t._M_impl.super__Rb_tree_header) break;
      if (bVar2 == false) {
        bVar10 = false;
      }
      else {
        lVar4 = std::__cxx11::string::find((char)p_Var3 + ' ',0x2d);
        bVar10 = lVar4 != -1;
      }
      poVar5 = std::operator<<((ostream *)&name,",");
      DependenceStruct::NameWithCompare_abi_cxx11_
                ((string *)&compAutoDepSet,(DependenceStruct *)(p_Var3 + 1));
      std::operator<<(poVar5,(string *)&compAutoDepSet);
      bVar9 = (bool)(bVar9 | bVar10);
      std::__cxx11::string::~string((string *)&compAutoDepSet);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&compAutoDepSet,"Dependencies",(allocator<char> *)&local_450);
    std::__cxx11::stringbuf::str();
    cmXMLWriter::Element<std::__cxx11::string>(&xout,(string *)&compAutoDepSet,&path_3);
    std::__cxx11::string::~string((string *)&path_3);
    std::__cxx11::string::~string((string *)&compAutoDepSet);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
  }
  compAutoDepSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &compAutoDepSet._M_t._M_impl.super__Rb_tree_header._M_header;
  compAutoDepSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  compAutoDepSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  compAutoDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  compAutoDepSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       compAutoDepSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var3 = (this->AlienAutoDependOn)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->AlienAutoDependOn)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::
    _Rb_tree<cmCPackIFWPackage::DependenceStruct,cmCPackIFWPackage::DependenceStruct,std::_Identity<cmCPackIFWPackage::DependenceStruct>,std::less<cmCPackIFWPackage::DependenceStruct>,std::allocator<cmCPackIFWPackage::DependenceStruct>>
    ::_M_insert_unique<cmCPackIFWPackage::DependenceStruct_const&>
              ((_Rb_tree<cmCPackIFWPackage::DependenceStruct,cmCPackIFWPackage::DependenceStruct,std::_Identity<cmCPackIFWPackage::DependenceStruct>,std::less<cmCPackIFWPackage::DependenceStruct>,std::allocator<cmCPackIFWPackage::DependenceStruct>>
                *)&compAutoDepSet,*(DependenceStruct **)(p_Var3 + 1));
  }
  if (compAutoDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
    p_Var3 = compAutoDepSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (bVar2 == false) {
      bVar10 = false;
    }
    else {
      lVar4 = std::__cxx11::string::find
                        ((char)compAutoDepSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left +
                         ' ',0x2d);
      bVar10 = lVar4 != -1;
    }
    DependenceStruct::NameWithCompare_abi_cxx11_(&path_3,(DependenceStruct *)(p_Var3 + 1));
    std::operator<<((ostream *)&name,(string *)&path_3);
    bVar9 = (bool)(bVar9 | bVar10);
    std::__cxx11::string::~string((string *)&path_3);
    while( true ) {
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      if ((_Rb_tree_header *)p_Var3 == &compAutoDepSet._M_t._M_impl.super__Rb_tree_header) break;
      if (bVar2 == false) {
        bVar10 = false;
      }
      else {
        lVar4 = std::__cxx11::string::find((char)p_Var3 + ' ',0x2d);
        bVar10 = lVar4 != -1;
      }
      poVar5 = std::operator<<((ostream *)&name,",");
      DependenceStruct::NameWithCompare_abi_cxx11_(&path_3,(DependenceStruct *)(p_Var3 + 1));
      std::operator<<(poVar5,(string *)&path_3);
      bVar9 = (bool)(bVar9 | bVar10);
      std::__cxx11::string::~string((string *)&path_3);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&path_3,"AutoDependOn",(allocator<char> *)&licenses);
    std::__cxx11::stringbuf::str();
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&path_3,&local_450);
    std::__cxx11::string::~string((string *)&local_450);
    std::__cxx11::string::~string((string *)&path_3);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
  }
  if (bVar9) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
    poVar5 = std::operator<<((ostream *)&name,"The dependencies for component \"");
    poVar5 = std::operator<<(poVar5,(string *)&this->Name);
    poVar5 = std::operator<<(poVar5,"\" specify names that contain hyphens. ");
    poVar5 = std::operator<<(poVar5,"This requires QtIFW 3.1 or later, but you are using version ");
    poVar5 = std::operator<<(poVar5,(string *)
                                    &((this->super_cmCPackIFWCommon).Generator)->FrameworkVersion);
    std::endl<char,std::char_traits<char>>(poVar5);
    pcVar1 = (this->super_cmCPackIFWCommon).Generator;
    if (pcVar1 != (cmCPackIFWGenerator *)0x0) {
      this_00 = (pcVar1->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(this_00,8,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                      ,0x2b5,path_3._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&path_3);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&licenses,&this->Licenses);
  uVar7 = 1;
  lVar4 = 0x20;
  while( true ) {
    if ((ulong)((long)licenses.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)licenses.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar7) break;
    cmsys::SystemTools::GetFilenameName
              (&name,(string *)
                     ((long)&((licenses.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4
                     ));
    std::operator+(&local_450,__lhs,"/meta/");
    std::operator+(&path_3,&local_450,&name);
    std::__cxx11::string::~string((string *)&local_450);
    cmsys::SystemTools::CopyFileIfDifferent
              ((string *)
               ((long)&((licenses.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4),
               &path_3);
    std::__cxx11::string::_M_assign
              ((string *)
               ((long)&((licenses.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4));
    std::__cxx11::string::~string((string *)&path_3);
    std::__cxx11::string::~string((string *)&name);
    uVar7 = uVar7 + 2;
    lVar4 = lVar4 + 0x40;
  }
  if (licenses.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      licenses.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"Licenses",(allocator<char> *)&path_3);
    cmXMLWriter::StartElement(&xout,&name);
    std::__cxx11::string::~string((string *)&name);
    lVar4 = 0;
    for (uVar7 = 0;
        uVar7 < (ulong)((long)licenses.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)licenses.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar7 = uVar7 + 2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"License",(allocator<char> *)&path_3);
      cmXMLWriter::StartElement(&xout,&name);
      std::__cxx11::string::~string((string *)&name);
      cmXMLWriter::Attribute<std::__cxx11::string>
                (&xout,"name",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&((licenses.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4));
      cmXMLWriter::Attribute<std::__cxx11::string>
                (&xout,"file",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&licenses.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p + lVar4));
      cmXMLWriter::EndElement(&xout);
      lVar4 = lVar4 + 0x40;
    }
    cmXMLWriter::EndElement(&xout);
  }
  if ((this->ForcedInstallation)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"ForcedInstallation",(allocator<char> *)&path_3);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->ForcedInstallation);
    std::__cxx11::string::~string((string *)&name);
  }
  if ((this->Replaces).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->Replaces).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
    pbVar8 = (this->Replaces).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::operator<<((ostream *)&name,(string *)pbVar8);
    while (pbVar8 = pbVar8 + 1,
          pbVar8 != (this->Replaces).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
      poVar5 = std::operator<<((ostream *)&name,",");
      std::operator<<(poVar5,(string *)pbVar8);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&path_3,"Replaces",&local_541);
    std::__cxx11::stringbuf::str();
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&path_3,&local_450);
    std::__cxx11::string::~string((string *)&local_450);
    std::__cxx11::string::~string((string *)&path_3);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
  }
  if ((this->RequiresAdminRights)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"RequiresAdminRights",(allocator<char> *)&path_3);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->RequiresAdminRights);
    std::__cxx11::string::~string((string *)&name);
  }
  if ((this->Virtual)._M_string_length == 0) {
    if ((this->Default)._M_string_length == 0) goto LAB_001b312b;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"Default",(allocator<char> *)&path_3);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->Default);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"Virtual",(allocator<char> *)&path_3);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->Virtual);
  }
  std::__cxx11::string::~string((string *)&name);
LAB_001b312b:
  if ((this->Essential)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"Essential",(allocator<char> *)&path_3);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->Essential);
    std::__cxx11::string::~string((string *)&name);
  }
  if ((this->SortingPriority)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"SortingPriority",(allocator<char> *)&path_3);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->SortingPriority);
    std::__cxx11::string::~string((string *)&name);
  }
  if ((this->Checkable)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"Checkable",(allocator<char> *)&path_3);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->Checkable);
    std::__cxx11::string::~string((string *)&name);
  }
  cmXMLWriter::EndElement(&xout);
  cmXMLWriter::EndDocument(&xout);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&licenses);
  std::
  _Rb_tree<cmCPackIFWPackage::DependenceStruct,_cmCPackIFWPackage::DependenceStruct,_std::_Identity<cmCPackIFWPackage::DependenceStruct>,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
  ::~_Rb_tree(&compAutoDepSet._M_t);
  std::
  _Rb_tree<cmCPackIFWPackage::DependenceStruct,_cmCPackIFWPackage::DependenceStruct,_std::_Identity<cmCPackIFWPackage::DependenceStruct>,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
  ::~_Rb_tree(&compDepSet._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&translations);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&userInterfaces);
  cmXMLWriter::~cmXMLWriter(&xout);
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  return;
}

Assistant:

void cmCPackIFWPackage::GeneratePackageFile()
{
  // Lazy directory initialization
  if (this->Directory.empty()) {
    if (this->Installer) {
      this->Directory = this->Installer->Directory + "/packages/" + this->Name;
    } else if (this->Generator) {
      this->Directory = this->Generator->toplevel + "/packages/" + this->Name;
    }
  }

  // Output stream
  cmGeneratedFileStream fout(this->Directory + "/meta/package.xml");
  cmXMLWriter xout(fout);

  xout.StartDocument();

  this->WriteGeneratedByToStrim(xout);

  xout.StartElement("Package");

  // DisplayName (with translations)
  for (auto const& dn : this->DisplayName) {
    xout.StartElement("DisplayName");
    if (!dn.first.empty()) {
      xout.Attribute("xml:lang", dn.first);
    }
    xout.Content(dn.second);
    xout.EndElement();
  }

  // Description (with translations)
  for (auto const& d : this->Description) {
    xout.StartElement("Description");
    if (!d.first.empty()) {
      xout.Attribute("xml:lang", d.first);
    }
    xout.Content(d.second);
    xout.EndElement();
  }

  // Update text
  if (!this->UpdateText.empty()) {
    xout.Element("UpdateText", this->UpdateText);
  }

  xout.Element("Name", this->Name);
  xout.Element("Version", this->Version);

  if (!this->ReleaseDate.empty()) {
    xout.Element("ReleaseDate", this->ReleaseDate);
  } else {
    xout.Element("ReleaseDate", cmTimestamp().CurrentTime("%Y-%m-%d", true));
  }

  // Script (copy to meta dir)
  if (!this->Script.empty()) {
    std::string name = cmSystemTools::GetFilenameName(this->Script);
    std::string path = this->Directory + "/meta/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->Script, path);
    xout.Element("Script", name);
  }

  // User Interfaces (copy to meta dir)
  std::vector<std::string> userInterfaces = this->UserInterfaces;
  for (std::string& userInterface : userInterfaces) {
    std::string name = cmSystemTools::GetFilenameName(userInterface);
    std::string path = this->Directory + "/meta/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(userInterface, path);
    userInterface = name;
  }
  if (!userInterfaces.empty()) {
    xout.StartElement("UserInterfaces");
    for (std::string const& userInterface : userInterfaces) {
      xout.Element("UserInterface", userInterface);
    }
    xout.EndElement();
  }

  // Translations (copy to meta dir)
  std::vector<std::string> translations = this->Translations;
  for (std::string& translation : translations) {
    std::string name = cmSystemTools::GetFilenameName(translation);
    std::string path = this->Directory + "/meta/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(translation, path);
    translation = name;
  }
  if (!translations.empty()) {
    xout.StartElement("Translations");
    for (std::string const& translation : translations) {
      xout.Element("Translation", translation);
    }
    xout.EndElement();
  }

  // Dependencies
  const bool hyphensInNamesUnsupported = this->Generator &&
    !this->Generator->FrameworkVersion.empty() && this->IsVersionLess("3.1");
  bool warnUnsupportedNames = false;
  std::set<DependenceStruct> compDepSet;
  for (DependenceStruct* ad : this->AlienDependencies) {
    compDepSet.insert(*ad);
  }
  for (cmCPackIFWPackage* d : this->Dependencies) {
    compDepSet.insert(DependenceStruct(d->Name));
  }
  // Write dependencies
  if (!compDepSet.empty()) {
    std::ostringstream dependencies;
    auto it = compDepSet.begin();
    warnUnsupportedNames |=
      hyphensInNamesUnsupported && it->Name.find('-') != std::string::npos;
    dependencies << it->NameWithCompare();
    ++it;
    while (it != compDepSet.end()) {
      warnUnsupportedNames |=
        hyphensInNamesUnsupported && it->Name.find('-') != std::string::npos;
      dependencies << "," << it->NameWithCompare();
      ++it;
    }
    xout.Element("Dependencies", dependencies.str());
  }

  // Automatic dependency on
  std::set<DependenceStruct> compAutoDepSet;
  for (DependenceStruct* aad : this->AlienAutoDependOn) {
    compAutoDepSet.insert(*aad);
  }
  // Write automatic dependency on
  if (!compAutoDepSet.empty()) {
    std::ostringstream dependencies;
    auto it = compAutoDepSet.begin();
    warnUnsupportedNames |=
      hyphensInNamesUnsupported && it->Name.find('-') != std::string::npos;
    dependencies << it->NameWithCompare();
    ++it;
    while (it != compAutoDepSet.end()) {
      warnUnsupportedNames |=
        hyphensInNamesUnsupported && it->Name.find('-') != std::string::npos;
      dependencies << "," << it->NameWithCompare();
      ++it;
    }
    xout.Element("AutoDependOn", dependencies.str());
  }

  if (warnUnsupportedNames) {
    cmCPackIFWLogger(
      WARNING,
      "The dependencies for component \""
        << this->Name << "\" specify names that contain hyphens. "
        << "This requires QtIFW 3.1 or later, but you are using version "
        << this->Generator->FrameworkVersion << std::endl);
  }

  // Licenses (copy to meta dir)
  std::vector<std::string> licenses = this->Licenses;
  for (size_t i = 1; i < licenses.size(); i += 2) {
    std::string name = cmSystemTools::GetFilenameName(licenses[i]);
    std::string path = this->Directory + "/meta/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(licenses[i], path);
    licenses[i] = name;
  }
  if (!licenses.empty()) {
    xout.StartElement("Licenses");
    for (size_t i = 0; i < licenses.size(); i += 2) {
      xout.StartElement("License");
      xout.Attribute("name", licenses[i]);
      xout.Attribute("file", licenses[i + 1]);
      xout.EndElement();
    }
    xout.EndElement();
  }

  if (!this->ForcedInstallation.empty()) {
    xout.Element("ForcedInstallation", this->ForcedInstallation);
  }

  // Replaces
  if (!this->Replaces.empty()) {
    std::ostringstream replaces;
    auto it = this->Replaces.begin();
    replaces << *it;
    ++it;
    while (it != this->Replaces.end()) {
      replaces << "," << *it;
      ++it;
    }
    xout.Element("Replaces", replaces.str());
  }

  if (!this->RequiresAdminRights.empty()) {
    xout.Element("RequiresAdminRights", this->RequiresAdminRights);
  }

  if (!this->Virtual.empty()) {
    xout.Element("Virtual", this->Virtual);
  } else if (!this->Default.empty()) {
    xout.Element("Default", this->Default);
  }

  // Essential
  if (!this->Essential.empty()) {
    xout.Element("Essential", this->Essential);
  }

  // Priority
  if (!this->SortingPriority.empty()) {
    xout.Element("SortingPriority", this->SortingPriority);
  }

  // Checkable
  if (!this->Checkable.empty()) {
    xout.Element("Checkable", this->Checkable);
  }

  xout.EndElement();
  xout.EndDocument();
}